

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall rtosc::Ports::Ports(Ports *this,initializer_list<rtosc::Port> l)

{
  allocator_type local_19;
  
  std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::vector(&this->ports,l,&local_19);
  (this->default_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->default_handler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->default_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->default_handler).super__Function_base._M_functor + 8) = 0;
  this->impl = (Port_Matcher *)0x0;
  refreshMagic(this);
  return;
}

Assistant:

Ports::Ports(std::initializer_list<Port> l)
    :ports(l), impl(NULL)
{
    refreshMagic();
}